

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O2

void __thiscall virgo::Chessboard::Chessboard(Chessboard *this)

{
  pair<virgo::Piece,_virgo::Player> *__s;
  byte bVar1;
  pair<virgo::Piece,_virgo::Player> pVar2;
  int s;
  long lVar3;
  int i;
  pair<virgo::Piece,_virgo::Player> local_38;
  
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = this->squares;
  memset(__s,0,0x200);
  this->castling_perm = '\0';
  this->fifty_mv_counter = '\0';
  this->next = WHITE;
  this->enpassant = 0x40;
  this->king_position[0] = 0x3c;
  this->king_position[1] = 4;
  this->all = 0xffff00000000ffff;
  this->pieces[0][0] = 0xff000000000000;
  this->pieces[0][1] = 0x8100000000000000;
  this->pieces[0][2] = 0x4200000000000000;
  this->pieces[0][3] = 0x2400000000000000;
  this->pieces[0][4] = 0x800000000000000;
  this->pieces[0][5] = 0x1000000000000000;
  this->pieces[1][0] = 0xff00;
  this->pieces[1][1] = 0x81;
  this->pieces[1][2] = 0x42;
  this->pieces[1][3] = 0x24;
  this->pieces[1][4] = 8;
  this->pieces[1][5] = 0x10;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    this->squares[lVar3].first = EMPTY;
    this->squares[lVar3].second = BLACK;
  }
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    pVar2 = *(pair<virgo::Piece,_virgo::Player> *)(this->pieces[0] + lVar3);
    while( true ) {
      if (pVar2 == (pair<virgo::Piece,_virgo::Player>)0x0) break;
      local_38 = pVar2;
      bVar1 = anon_unknown.dwarf_243e9::bit::pop_lsb_index((uint64_t *)&local_38);
      __s[bVar1].first = (Piece)lVar3;
      this->squares[bVar1].second = BLACK;
      pVar2 = (pair<virgo::Piece,_virgo::Player>)((ulong)pVar2 & (long)pVar2 - 1U);
    }
    for (pVar2 = this->squares[lVar3 + -6]; pVar2 != (pair<virgo::Piece,_virgo::Player>)0x0;
        pVar2 = (pair<virgo::Piece,_virgo::Player>)((ulong)pVar2 & (long)pVar2 - 1U)) {
      local_38 = pVar2;
      bVar1 = anon_unknown.dwarf_243e9::bit::pop_lsb_index((uint64_t *)&local_38);
      __s[bVar1].first = (Piece)lVar3;
      this->squares[bVar1].second = WHITE;
    }
  }
  return;
}

Assistant:

Chessboard::Chessboard() {
        // Initial chessboard setup
        this->castling_perm = 0x00;
        this->fifty_mv_counter = 0;
        this->next = WHITE;
        this->enpassant = INVALID;
        this->king_position[0] = e8;
        this->king_position[1] = e1;

        // Set chess starting position
        this->all = 0xffff00000000ffff;

        // Set black pieces
        this->pieces[0][PAWN] = 0x00ff000000000000; // Pawns
        this->pieces[0][ROOK] = 0x8100000000000000; // Rooks
        this->pieces[0][KNIGHT] = 0x4200000000000000; // Knights
        this->pieces[0][BISHOP] = 0x2400000000000000; // Bishops
        this->pieces[0][KING] = 0x0800000000000000; // King
        this->pieces[0][QUEEN] = 0x1000000000000000; // Queen

        // Set white pieces
        this->pieces[1][PAWN] = 0x000000000000ff00; // Pawns
        this->pieces[1][ROOK] = 0x0000000000000081; // Rooks
        this->pieces[1][KNIGHT] = 0x0000000000000042; // Knights
        this->pieces[1][BISHOP] = 0x0000000000000024; // Bishops
        this->pieces[1][KING] = 0x0000000000000008; // King
        this->pieces[1][QUEEN] = 0x0000000000000010; // Queen

        // Fill with empty values
        for(int s = a1; s <= h8; s++) {
            this->squares[s] = std::make_pair(EMPTY, BLACK);
        }

        // Set every pair which has a piece on the corresponding square index
        for(int i = PAWN; i <= QUEEN; i++) {
            uint64_t board = this->pieces[BLACK][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), BLACK);
                board &= (board-1);
            }
            board = this->pieces[WHITE][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), WHITE);
                board &= (board-1);
            }
        }
    }